

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O0

string * __thiscall
soul::AST::CallOrCastBase::getDescription
          (string *__return_storage_ptr__,CallOrCastBase *this,string *name)

{
  bool bVar1;
  Type *this_00;
  undefined1 in_R8B;
  ArrayView<soul::Type> types;
  ArrayView<soul::Type> types_00;
  ArrayView<soul::Type> local_1c0;
  string local_1b0;
  undefined4 local_18c;
  ArrayView<soul::Type> local_188;
  ArrayView<soul::Type> local_178;
  string local_168;
  string local_148;
  string local_128;
  undefined1 local_f8 [8];
  TypeArray argTypes;
  string *name_local;
  CallOrCastBase *this_local;
  
  argTypes.space[0x17] = (uint64_t)name;
  getArgumentTypes((TypeArray *)local_f8,this);
  if ((this->isMethodCall & 1U) == 0) {
    ArrayView<soul::Type>::ArrayView<soul::ArrayWithPreallocation<soul::Type,8ul>>
              (&local_1c0,(ArrayWithPreallocation<soul::Type,_8UL> *)local_f8);
    types_00.e = (Type *)0x1;
    types_00.s = local_1c0.e;
    heart::Utilities::getDescriptionOfTypeList_abi_cxx11_
              (&local_1b0,(Utilities *)local_1c0.s,types_00,(bool)in_R8B);
    std::operator+(__return_storage_ptr__,name,&local_1b0);
    std::__cxx11::string::~string((string *)&local_1b0);
  }
  else {
    bVar1 = ArrayWithPreallocation<soul::Type,_8UL>::empty
                      ((ArrayWithPreallocation<soul::Type,_8UL> *)local_f8);
    checkAssertion(!bVar1,"! argTypes.empty()","getDescription",0x893);
    this_00 = ArrayWithPreallocation<soul::Type,_8UL>::front
                        ((ArrayWithPreallocation<soul::Type,_8UL> *)local_f8);
    Type::getDescription_abi_cxx11_(&local_148,this_00);
    TokenisedPathString::join(&local_128,&local_148,name);
    ArrayView<soul::Type>::ArrayView<soul::ArrayWithPreallocation<soul::Type,8ul>>
              (&local_188,(ArrayWithPreallocation<soul::Type,_8UL> *)local_f8);
    local_178 = ArrayView<soul::Type>::tail(&local_188);
    types.s = local_178.e;
    types.e = (Type *)0x1;
    heart::Utilities::getDescriptionOfTypeList_abi_cxx11_
              (&local_168,(Utilities *)local_178.s,types,(bool)in_R8B);
    std::operator+(__return_storage_ptr__,&local_128,&local_168);
    std::__cxx11::string::~string((string *)&local_168);
    std::__cxx11::string::~string((string *)&local_128);
    std::__cxx11::string::~string((string *)&local_148);
  }
  local_18c = 1;
  ArrayWithPreallocation<soul::Type,_8UL>::~ArrayWithPreallocation
            ((ArrayWithPreallocation<soul::Type,_8UL> *)local_f8);
  return __return_storage_ptr__;
}

Assistant:

std::string getDescription (std::string name) const
        {
            auto argTypes = getArgumentTypes();

            if (isMethodCall)
            {
                SOUL_ASSERT (! argTypes.empty());

                return TokenisedPathString::join (argTypes.front().getDescription(), name)
                        + heart::Utilities::getDescriptionOfTypeList (ArrayView<Type> (argTypes).tail(), true);
            }

            return name + heart::Utilities::getDescriptionOfTypeList (argTypes, true);
        }